

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr_cnv.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UnicodeString::extract
          (UnicodeString *this,char *dest,int32_t destCapacity,UConverter *cnv,UErrorCode *errorCode
          )

{
  ushort uVar1;
  short sVar2;
  int32_t iVar3;
  UConverter *cnv_00;
  
  iVar3 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
    if ((destCapacity < 0 || (uVar1 & 1) != 0) || (dest == (char *)0x0 && destCapacity != 0)) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      iVar3 = 0;
    }
    else {
      if (uVar1 < 0x20) {
        iVar3 = u_terminateChars_63(dest,destCapacity,0,errorCode);
        return iVar3;
      }
      if (cnv == (UConverter *)0x0) {
        cnv_00 = u_getDefaultConverter_63(errorCode);
        if (U_ZERO_ERROR < *errorCode) {
          return 0;
        }
      }
      else {
        ucnv_resetFromUnicode_63(cnv);
        cnv_00 = cnv;
      }
      sVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar3 = (this->fUnion).fFields.fLength;
      }
      else {
        iVar3 = (int)sVar2 >> 5;
      }
      iVar3 = doExtract(this,0,iVar3,dest,destCapacity,cnv_00,errorCode);
      if (cnv == (UConverter *)0x0) {
        u_releaseDefaultConverter_63(cnv_00);
      }
    }
  }
  return iVar3;
}

Assistant:

int32_t
UnicodeString::extract(char *dest, int32_t destCapacity,
                       UConverter *cnv,
                       UErrorCode &errorCode) const
{
    if(U_FAILURE(errorCode)) {
        return 0;
    }

    if(isBogus() || destCapacity<0 || (destCapacity>0 && dest==0)) {
        errorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    // nothing to do?
    if(isEmpty()) {
        return u_terminateChars(dest, destCapacity, 0, &errorCode);
    }

    // get the converter
    UBool isDefaultConverter;
    if(cnv==0) {
        isDefaultConverter=TRUE;
        cnv=u_getDefaultConverter(&errorCode);
        if(U_FAILURE(errorCode)) {
            return 0;
        }
    } else {
        isDefaultConverter=FALSE;
        ucnv_resetFromUnicode(cnv);
    }

    // convert
    int32_t len=doExtract(0, length(), dest, destCapacity, cnv, errorCode);

    // release the converter
    if(isDefaultConverter) {
        u_releaseDefaultConverter(cnv);
    }

    return len;
}